

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O3

void AddAttributesToAttrDataList(SstStream Stream,_TimestepMetadataMsg *Msg)

{
  void *__ptr;
  SstData p_Var1;
  size_t __size;
  _SstBlock *p_Var2;
  char *__dest;
  long lVar3;
  
  if (Stream->AttrsRetrieved != 0) {
    p_Var2 = Stream->InternalAttrDataInfo;
    if (p_Var2 != (_SstBlock *)0x0) {
      lVar3 = 8;
      do {
        __ptr = *(void **)((long)&p_Var2->BlockSize + lVar3);
        if (__ptr == (void *)0x0) goto LAB_0072c27b;
        free(__ptr);
        p_Var2 = Stream->InternalAttrDataInfo;
        lVar3 = lVar3 + 0x10;
      } while (p_Var2 != (_SstBlock *)0x0);
    }
    p_Var2 = (_SstBlock *)0x0;
LAB_0072c27b:
    free(p_Var2);
    Stream->InternalAttrDataInfo = (_SstBlock *)0x0;
    Stream->AttrsRetrieved = 0;
    Stream->InternalAttrDataCount = 0;
  }
  if (Msg->AttributeData->DataSize != 0) {
    p_Var2 = (_SstBlock *)
             realloc(Stream->InternalAttrDataInfo,(long)Stream->InternalAttrDataCount * 0x10 + 0x20)
    ;
    Stream->InternalAttrDataInfo = p_Var2;
    lVar3 = (long)Stream->InternalAttrDataCount;
    Stream->InternalAttrDataCount = (int)(lVar3 + 1);
    p_Var1 = Msg->AttributeData;
    __size = p_Var1->DataSize;
    __dest = (char *)malloc(__size);
    p_Var2[lVar3].BlockData = __dest;
    p_Var2[lVar3].BlockSize = __size;
    memcpy(__dest,p_Var1->block,__size);
    p_Var2[lVar3 + 1].BlockSize = 0;
    p_Var2[lVar3 + 1].BlockData = (char *)0x0;
  }
  return;
}

Assistant:

void AddAttributesToAttrDataList(SstStream Stream, struct _TimestepMetadataMsg *Msg)
{
    if (Stream->AttrsRetrieved)
    {
        int i = 0;
        while (Stream->InternalAttrDataInfo && Stream->InternalAttrDataInfo[i].BlockData)
        {
            free(Stream->InternalAttrDataInfo[i].BlockData);
            i++;
        }
        free(Stream->InternalAttrDataInfo);
        Stream->InternalAttrDataInfo = NULL;
        Stream->InternalAttrDataCount = 0;
        Stream->AttrsRetrieved = 0;
    }
    if (Msg->AttributeData->DataSize == 0)
        return;

    Stream->InternalAttrDataInfo =
        realloc(Stream->InternalAttrDataInfo,
                (sizeof(struct _SstBlock) * (Stream->InternalAttrDataCount + 2)));
    struct _SstBlock *NewInfo = &Stream->InternalAttrDataInfo[Stream->InternalAttrDataCount];
    Stream->InternalAttrDataCount++;
    NewInfo->BlockData = malloc(Msg->AttributeData->DataSize);
    NewInfo->BlockSize = Msg->AttributeData->DataSize;
    memcpy(NewInfo->BlockData, Msg->AttributeData->block, Msg->AttributeData->DataSize);
    memset(&Stream->InternalAttrDataInfo[Stream->InternalAttrDataCount], 0,
           sizeof(struct _SstData));
}